

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

ON_ClippingPlaneData * __thiscall
ON_ClippingPlaneDataList::AppendNew(ON_ClippingPlaneDataList *this)

{
  uint uVar1;
  ON_ClippingPlaneData *this_00;
  ON_ClippingPlaneData *data;
  
  this_00 = (ON_ClippingPlaneData *)operator_new(0x50);
  ON_ClippingPlaneData::ON_ClippingPlaneData(this_00);
  data = this_00;
  ON_SimpleArray<ON_ClippingPlaneData_*>::Append(&this->m_list,&data);
  uVar1 = AppendNew::serial_number + 1;
  data->m_sn = AppendNew::serial_number;
  AppendNew::serial_number = uVar1;
  return data;
}

Assistant:

ON_ClippingPlaneData* ON_ClippingPlaneDataList::AppendNew()
{
  static unsigned int serial_number = 1;
  ON_ClippingPlaneData* data = new ON_ClippingPlaneData();
  m_list.Append(data);
  data->m_sn = serial_number++;
  return data;
}